

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O1

int dmy_to_mjd2000_julian(int D,int M,int Y,int *jd)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if (((0 < D) && (Y != 0)) && (0xfffffff3 < M - 0xdU)) {
    uVar2 = 0;
    if (M == 2) {
      uVar2 = (uint)((Y - (Y >> 0x1f) & 3U) == 0);
    }
    if (D <= (int)((*(int *)(&DAT_00196a30 + (ulong)(uint)M * 4) -
                   *(int *)(&DAT_00196a30 + (ulong)(M - 1) * 4)) + uVar2)) {
      iVar1 = -(Y >> 0x1f);
      uVar3 = iVar1 + Y;
      uVar2 = iVar1 + Y + 3;
      if (-1 < (int)uVar3) {
        uVar2 = uVar3;
      }
      *jd = ((D + uVar3 * 0x16d + ((int)uVar2 >> 2) + ((int)(uVar3 - (uVar2 & 0xfffffffc)) >> 0x1f))
            - (uint)((uVar3 & 3) == 0 && M < 3)) + *(int *)(&DAT_00196a30 + (ulong)(M - 1) * 4) +
            0x1a42e2;
      return 0;
    }
  }
  coda_set_error(-0x68,"invalid date/time argument (%02d-%02d-%04d)",D,(ulong)(uint)M);
  return -1;
}

Assistant:

static int dmy_to_mjd2000_julian(int D, int M, int Y, int *jd)
{
    const int offset[13] = { 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334, 365 };

    /* check input */
    if (Y == 0 || M < 1 || M > 12 || D < 1 || D > offset[M] - offset[M - 1] + ((M == 2) && (y(Y) % 4 == 0)))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "invalid date/time argument (%02d-%02d-%04d)", D, M, Y);
        return -1;
    }

    *jd = D + 365 * y(Y) + int_div(y(Y), 4) + offset[M - 1] - ((M <= 2) && (y(Y) % 4 == 0)) + 1721058;

    return 0;
}